

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpt_helper.c
# Opt level: O0

void cpu_x86_update_dr7_x86_64(CPUX86State *env,uint32_t new_dr7)

{
  ulong uVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int local_28;
  int mod;
  int i;
  int iobpt;
  target_ulong old_dr7;
  uint32_t new_dr7_local;
  CPUX86State *env_local;
  
  uVar1 = env->dr[7];
  mod = 0;
  uVar3 = new_dr7 | 0x400;
  if (((uVar1 ^ uVar3) & 0xffffffffffffff00) == 0) {
    uVar4 = (((uint)uVar1 | (uint)(uVar1 << 1)) ^ (uVar3 | uVar3 << 1)) & 0xff;
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      if (((uVar4 & 2 << ((byte)(local_28 << 1) & 0x1f)) != 0) &&
         (_Var2 = hw_breakpoint_enabled((ulong)uVar3,local_28), !_Var2)) {
        hw_breakpoint_remove(env,local_28);
      }
    }
    env->dr[7] = (ulong)uVar3;
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      if (((uVar4 & 2 << ((byte)(local_28 << 1) & 0x1f)) == 0) ||
         (_Var2 = hw_breakpoint_enabled((ulong)uVar3,local_28), !_Var2)) {
        iVar6 = hw_breakpoint_type((ulong)uVar3,local_28);
        if ((iVar6 == 2) && (_Var2 = hw_breakpoint_enabled((ulong)uVar3,local_28), _Var2)) {
          mod = mod | 0x1000000;
        }
      }
      else {
        uVar5 = hw_breakpoint_insert(env,local_28);
        mod = uVar5 | mod;
      }
    }
  }
  else {
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      hw_breakpoint_remove(env,local_28);
    }
    env->dr[7] = (ulong)uVar3;
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      uVar3 = hw_breakpoint_insert(env,local_28);
      mod = uVar3 | mod;
    }
  }
  env->hflags = env->hflags & 0xfeffffff | mod;
  return;
}

Assistant:

void cpu_x86_update_dr7(CPUX86State *env, uint32_t new_dr7)
{
    target_ulong old_dr7 = env->dr[7];
    int iobpt = 0;
    int i;

    new_dr7 |= DR7_FIXED_1;

    /* If nothing is changing except the global/local enable bits,
       then we can make the change more efficient.  */
    if (((old_dr7 ^ new_dr7) & ~0xff) == 0) {
        /* Fold the global and local enable bits together into the
           global fields, then xor to show which registers have
           changed collective enable state.  */
        int mod = ((old_dr7 | old_dr7 * 2) ^ (new_dr7 | new_dr7 * 2)) & 0xff;

        for (i = 0; i < DR7_MAX_BP; i++) {
            if ((mod & (2 << i * 2)) && !hw_breakpoint_enabled(new_dr7, i)) {
                hw_breakpoint_remove(env, i);
            }
        }
        env->dr[7] = new_dr7;
        for (i = 0; i < DR7_MAX_BP; i++) {
            if (mod & (2 << i * 2) && hw_breakpoint_enabled(new_dr7, i)) {
                iobpt |= hw_breakpoint_insert(env, i);
            } else if (hw_breakpoint_type(new_dr7, i) == DR7_TYPE_IO_RW
                       && hw_breakpoint_enabled(new_dr7, i)) {
                iobpt |= HF_IOBPT_MASK;
            }
        }
    } else {
        for (i = 0; i < DR7_MAX_BP; i++) {
            hw_breakpoint_remove(env, i);
        }
        env->dr[7] = new_dr7;
        for (i = 0; i < DR7_MAX_BP; i++) {
            iobpt |= hw_breakpoint_insert(env, i);
        }
    }

    env->hflags = (env->hflags & ~HF_IOBPT_MASK) | iobpt;
}